

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsInterface.cpp
# Opt level: O2

void __thiscall helics::CommsInterface::logMessage(CommsInterface *this,string_view message)

{
  ostream *poVar1;
  basic_string_view<char,_std::char_traits<char>_> __args_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if ((this->loggingCallback).super__Function_base._M_manager != (_Manager_type)0x0) {
    std::operator+(&local_48,"commMessage||",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->name)
    ;
    __args_1._M_str = local_48._M_dataplus._M_p;
    __args_1._M_len = local_48._M_string_length;
    std::
    function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
    ::operator()(&this->loggingCallback,0xc,__args_1,message);
    std::__cxx11::string::~string((string *)&local_48);
    return;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"commMessage||");
  poVar1 = std::operator<<(poVar1,(string *)&this->name);
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,message._M_str,message._M_len);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void CommsInterface::logMessage(std::string_view message) const
{
    if (loggingCallback) {
        loggingCallback(HELICS_LOG_LEVEL_INTERFACES, "commMessage||" + name, message);
    } else {
        std::cout << "commMessage||" << name << ":" << message << std::endl;
    }
}